

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O3

void __thiscall Farm::createBasket(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  Basket basket;
  int nif;
  double weight;
  string local_78;
  int local_54;
  double local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  undefined1 local_28 [12];
  
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Enter client\'s nif: ","");
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_54,&local_78,(function<bool_(int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p._0_4_ = local_54;
  iVar2 = std::
          _Hashtable<int,_std::pair<const_int,_Client>,_std::allocator<std::pair<const_int,_Client>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->clients)._M_h,(key_type *)&local_78);
  if (iVar2.super__Node_iterator_base<std::pair<const_int,_Client>,_false>._M_cur ==
      (__node_type *)0x0) {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!","");
    cinERR(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ENTER to go back","");
    enterWait(&local_78);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Enter basket weight: ","");
    getDouble(&local_50,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    Basket::Basket((Basket *)local_28,local_50,local_54);
    basket._12_4_ = 0;
    basket.weight = (double)local_28._0_8_;
    basket.client_nif = local_28._8_4_;
    addBasket(this,basket);
    this->clientsFileChanged = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Basket successfully created!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"ENTER to go back","");
    enterWait(&local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Farm::createBasket() {
    int nif;
    double weight;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    getDouble(weight, "Enter basket weight: ");

    addBasket(Basket(weight, nif));

    clientsFileChanged = true;
    cout << "Basket successfully created!" << endl;
    enterWait();
}